

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

void __thiscall ObjectFileDB::get_objs_from_dgo(ObjectFileDB *this,string *filename)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint amount;
  _Alloc_hider _Var4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  BinaryReader *pBVar6;
  char *pcVar7;
  pointer pcVar8;
  allocator local_131;
  BinaryReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dgo_data;
  string dgo_base_name;
  BinaryReader compressed_reader;
  DgoHeader header;
  string local_50;
  
  read_binary_file(&dgo_data,filename);
  reader.size = (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
                (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  (this->stats).total_dgo_bytes = (this->stats).total_dgo_bytes + reader.size;
  bVar1 = true;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    bVar1 = (bool)(bVar1 & (int)(char)(&DAT_0014d60b)[lVar5] ==
                           (uint)dgo_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar5]);
  }
  if (bVar1) {
    iVar2 = __lzo_init_v2(0x20a0,2,4,8,4,8,8,8,8,0x30);
    if (iVar2 != 0) {
      pcVar7 = "false";
      uVar3 = 0x59;
LAB_0012f9f3:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                    ,uVar3,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
    }
    compressed_reader.buffer =
         dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    compressed_reader.size =
         (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
         (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    compressed_reader.seek = 0;
    BinaryReader::ffwd(&compressed_reader,4);
    uVar3 = BinaryReader::read<unsigned_int>(&compressed_reader);
    header.size = 0;
    header.name[0] = '\0';
    header.name[1] = '\0';
    header.name[2] = '\0';
    header.name[3] = '\0';
    header.name[4] = '\0';
    header.name[5] = '\0';
    header.name[6] = '\0';
    header.name[7] = '\0';
    header.name[8] = '\0';
    header.name[9] = '\0';
    header.name[10] = '\0';
    header.name[0xb] = '\0';
    header.name[0xc] = '\0';
    header.name[0xd] = '\0';
    header.name[0xe] = '\0';
    header.name[0xf] = '\0';
    header.name[0x10] = '\0';
    header.name[0x11] = '\0';
    header.name[0x12] = '\0';
    header.name[0x13] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header,
               (size_type)(ulong)uVar3);
    pcVar8 = (pointer)0x0;
    while( true ) {
      amount = 0;
      while (amount == 0) {
        amount = BinaryReader::read<unsigned_int>(&compressed_reader);
      }
      if (amount < 0x8000) {
        iVar2 = lzo1x_decompress(compressed_reader.buffer + compressed_reader.seek,(ulong)amount,
                                 (uchar *)(pcVar8 + header._0_8_),(lzo_uint *)&dgo_base_name,
                                 (void *)0x0);
        if (iVar2 != 0) {
          pcVar7 = "lzo_rv == LZO_E_OK";
          uVar3 = 0x6e;
          goto LAB_0012f9f3;
        }
        BinaryReader::ffwd(&compressed_reader,amount);
        _Var4 = dgo_base_name._M_dataplus;
      }
      else {
        _Var4._M_p = (pointer)0x8000;
        memcpy(pcVar8 + header._0_8_,compressed_reader.buffer + compressed_reader.seek,0x8000);
        BinaryReader::ffwd(&compressed_reader,0x8000);
      }
      pcVar8 = pcVar8 + _Var4._M_p;
      if ((pointer)(ulong)uVar3 <= pcVar8) break;
      while ((compressed_reader.seek & 3) != 0) {
        BinaryReader::ffwd(&compressed_reader,1);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&dgo_data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&header);
    reader.size = (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                  (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  }
  reader.seek = 0;
  reader.buffer =
       dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  BinaryReader::read<DgoHeader>(&header,&reader);
  base_name(&dgo_base_name,filename);
  __rhs = &dgo_base_name;
  bVar1 = std::operator==(header.name,__rhs);
  if (!bVar1) {
    __assert_fail("header.name == dgo_base_name",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                  ,0x86,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
  }
  anon_unknown.dwarf_317c7::assert_string_empty_after(header.name,(int)__rhs);
  uVar3 = 0;
  pcVar7 = (char *)((long)&compressed_reader.buffer + 4);
  while( true ) {
    if (header.size <= uVar3) {
      if (reader.size == reader.seek) {
        std::__cxx11::string::~string((string *)&dgo_base_name);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return;
      }
      __assert_fail("0 == reader.bytes_left()",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                    ,0x94,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
    }
    pBVar6 = &reader;
    BinaryReader::read<DgoHeader>((DgoHeader *)&compressed_reader,&reader);
    if (reader.size - reader.seek < (uint)compressed_reader.buffer) break;
    anon_unknown.dwarf_317c7::assert_string_empty_after(pcVar7,(int)pBVar6);
    std::__cxx11::string::string((string *)&local_50,pcVar7,&local_131);
    add_obj_from_dgo(this,&local_50,reader.buffer + reader.seek,(uint)compressed_reader.buffer,
                     &dgo_base_name);
    std::__cxx11::string::~string((string *)&local_50);
    BinaryReader::ffwd(&reader,(uint)compressed_reader.buffer);
    uVar3 = uVar3 + 1;
  }
  __assert_fail("reader.bytes_left() >= obj_header.size",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                ,0x8c,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
}

Assistant:

void ObjectFileDB::get_objs_from_dgo(const std::string& filename) {
  auto dgo_data = read_binary_file(filename);
  stats.total_dgo_bytes += dgo_data.size();

  const char jak2_header[] = "oZlB";
  bool is_jak2 = true;
  for (int i = 0; i < 4; i++) {
    if (jak2_header[i] != dgo_data[i]) {
      is_jak2 = false;
    }
  }

  if (is_jak2) {
    if (lzo_init() != LZO_E_OK) {
      assert(false);
    }
    BinaryReader compressed_reader(dgo_data);
    // seek past oZlB
    compressed_reader.ffwd(4);
    auto decompressed_size = compressed_reader.read<uint32_t>();
    std::vector<uint8_t> decompressed_data;
    decompressed_data.resize(decompressed_size);
    size_t output_offset = 0;
    while (true) {
      // seek past alignment bytes and read the next chunk size
      uint32_t chunk_size = 0;
      while (!chunk_size) {
        chunk_size = compressed_reader.read<uint32_t>();
      }

      if (chunk_size < MAX_CHUNK_SIZE) {
        lzo_uint bytes_written;
        auto lzo_rv =
            lzo1x_decompress(compressed_reader.here(), chunk_size,
                             decompressed_data.data() + output_offset, &bytes_written, nullptr);
        assert(lzo_rv == LZO_E_OK);
        compressed_reader.ffwd(chunk_size);
        output_offset += bytes_written;
      } else {
        // nope - sometimes chunk_size is bigger than MAX, but we should still use max.
        //        assert(chunk_size == MAX_CHUNK_SIZE);
        memcpy(decompressed_data.data() + output_offset, compressed_reader.here(), MAX_CHUNK_SIZE);
        compressed_reader.ffwd(MAX_CHUNK_SIZE);
        output_offset += MAX_CHUNK_SIZE;
      }

      if (output_offset >= decompressed_size)
        break;
      while (compressed_reader.get_seek() % 4) {
        compressed_reader.ffwd(1);
      }
    }
    dgo_data = decompressed_data;
  }

  BinaryReader reader(dgo_data);
  auto header = reader.read<DgoHeader>();

  auto dgo_base_name = base_name(filename);
  assert(header.name == dgo_base_name);
  assert_string_empty_after(header.name, 60);

  // get all obj files...
  for (uint32_t i = 0; i < header.size; i++) {
    auto obj_header = reader.read<DgoHeader>();
    assert(reader.bytes_left() >= obj_header.size);
    assert_string_empty_after(obj_header.name, 60);

    add_obj_from_dgo(obj_header.name, reader.here(), obj_header.size, dgo_base_name);
    reader.ffwd(obj_header.size);
  }

  // check we're at the end
  assert(0 == reader.bytes_left());
}